

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O1

void CDiskBlockIndex::SerializationOps<DataStream,CDiskBlockIndex_const,ActionSerialize>
               (long obj,DataStream *s)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock0;
  undefined4 local_2c;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &cs_main.super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  WriteVarInt<DataStream,(VarIntMode)1,int>(s,0x3f73c);
  WriteVarInt<DataStream,(VarIntMode)1,int>(s,*(int *)(obj + 0x18));
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,*(uint *)(obj + 0x58));
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,*(uint *)(obj + 0x48));
  if ((*(byte *)(obj + 0x58) & 0x18) != 0) {
    WriteVarInt<DataStream,(VarIntMode)1,int>(s,*(int *)(obj + 0x1c));
  }
  if ((*(byte *)(obj + 0x58) & 8) != 0) {
    WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,*(uint *)(obj + 0x20));
  }
  if ((*(byte *)(obj + 0x58) & 0x10) != 0) {
    WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,*(uint *)(obj + 0x24));
  }
  local_2c = *(undefined4 *)(obj + 0x5c);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_2c);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,obj + 0x94,obj + 0xb4);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,obj + 0x60,obj + 0x80);
  local_2c = *(undefined4 *)(obj + 0x80);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_2c);
  local_2c = *(undefined4 *)(obj + 0x84);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_2c);
  local_2c = *(undefined4 *)(obj + 0x88);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_2c);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CDiskBlockIndex, obj)
    {
        LOCK(::cs_main);
        int _nVersion = DUMMY_VERSION;
        READWRITE(VARINT_MODE(_nVersion, VarIntMode::NONNEGATIVE_SIGNED));

        READWRITE(VARINT_MODE(obj.nHeight, VarIntMode::NONNEGATIVE_SIGNED));
        READWRITE(VARINT(obj.nStatus));
        READWRITE(VARINT(obj.nTx));
        if (obj.nStatus & (BLOCK_HAVE_DATA | BLOCK_HAVE_UNDO)) READWRITE(VARINT_MODE(obj.nFile, VarIntMode::NONNEGATIVE_SIGNED));
        if (obj.nStatus & BLOCK_HAVE_DATA) READWRITE(VARINT(obj.nDataPos));
        if (obj.nStatus & BLOCK_HAVE_UNDO) READWRITE(VARINT(obj.nUndoPos));

        // block header
        READWRITE(obj.nVersion);
        READWRITE(obj.hashPrev);
        READWRITE(obj.hashMerkleRoot);
        READWRITE(obj.nTime);
        READWRITE(obj.nBits);
        READWRITE(obj.nNonce);
    }